

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_audio_buffer_alloc_and_init
                    (ma_audio_buffer_config *pConfig,ma_audio_buffer **ppAudioBuffer)

{
  ma_uint8 *__s;
  undefined1 *__src;
  ma_result mVar1;
  ma_audio_buffer *pAudioBuffer;
  size_t __n;
  int __c;
  ma_audio_buffer_config innerConfig;
  ma_audio_buffer_config local_68;
  
  if (ppAudioBuffer == (ma_audio_buffer **)0x0) {
    return MA_INVALID_ARGS;
  }
  *ppAudioBuffer = (ma_audio_buffer *)0x0;
  if (pConfig == (ma_audio_buffer_config *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_68.format = pConfig->format;
  local_68.channels = pConfig->channels;
  local_68.sampleRate = pConfig->sampleRate;
  local_68._12_4_ = *(undefined4 *)&pConfig->field_0xc;
  local_68.sizeInFrames = pConfig->sizeInFrames;
  local_68.pData = pConfig->pData;
  local_68.allocationCallbacks.pUserData = (pConfig->allocationCallbacks).pUserData;
  local_68.allocationCallbacks.onMalloc = (pConfig->allocationCallbacks).onMalloc;
  local_68.allocationCallbacks.onRealloc = (pConfig->allocationCallbacks).onRealloc;
  local_68.allocationCallbacks.onFree = (pConfig->allocationCallbacks).onFree;
  ma_allocation_callbacks_init_copy(&local_68.allocationCallbacks,&pConfig->allocationCallbacks);
  if (local_68.allocationCallbacks.onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    pAudioBuffer = (ma_audio_buffer *)0x0;
  }
  else {
    pAudioBuffer = (ma_audio_buffer *)
                   (*local_68.allocationCallbacks.onMalloc)
                             ((ulong)(pConfig->channels * (&DAT_0017d490)[pConfig->format]) *
                              pConfig->sizeInFrames + 0x97,local_68.allocationCallbacks.pUserData);
  }
  if (pAudioBuffer == (ma_audio_buffer *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  __src = (undefined1 *)pConfig->pData;
  __s = pAudioBuffer->_pExtraData;
  if (__src == (undefined1 *)0x0) {
    if ((ulong)pConfig->format == 1) {
      __n = pConfig->sizeInFrames * (ulong)pConfig->channels;
      if (__n == 0) goto LAB_00147460;
      __c = 0x80;
    }
    else {
      __n = pConfig->sizeInFrames * (ulong)(pConfig->channels * (&DAT_0017d490)[pConfig->format]);
      if (__n == 0) goto LAB_00147460;
      __c = 0;
    }
    memset(__s,__c,__n);
  }
  else if (__s != __src) {
    memcpy(__s,__src,
           (ulong)((&DAT_0017d490)[pConfig->format] * pConfig->channels) * pConfig->sizeInFrames);
  }
LAB_00147460:
  local_68.pData = __s;
  mVar1 = ma_audio_buffer_init_ex(&local_68,0,pAudioBuffer);
  if (mVar1 == MA_SUCCESS) {
    *ppAudioBuffer = pAudioBuffer;
    mVar1 = MA_SUCCESS;
  }
  else if (local_68.allocationCallbacks.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
    (*local_68.allocationCallbacks.onFree)(pAudioBuffer,local_68.allocationCallbacks.pUserData);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_alloc_and_init(const ma_audio_buffer_config* pConfig, ma_audio_buffer** ppAudioBuffer)
{
    ma_result result;
    ma_audio_buffer* pAudioBuffer;
    ma_audio_buffer_config innerConfig; /* We'll be making some changes to the config, so need to make a copy. */
    ma_uint64 allocationSizeInBytes;

    if (ppAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    *ppAudioBuffer = NULL;  /* Safety. */

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    innerConfig = *pConfig;
    ma_allocation_callbacks_init_copy(&innerConfig.allocationCallbacks, &pConfig->allocationCallbacks);

    allocationSizeInBytes = sizeof(*pAudioBuffer) - sizeof(pAudioBuffer->_pExtraData) + (pConfig->sizeInFrames * ma_get_bytes_per_frame(pConfig->format, pConfig->channels));
    if (allocationSizeInBytes > MA_SIZE_MAX) {
        return MA_OUT_OF_MEMORY;    /* Too big. */
    }

    pAudioBuffer = (ma_audio_buffer*)ma_malloc((size_t)allocationSizeInBytes, &innerConfig.allocationCallbacks);  /* Safe cast to size_t. */
    if (pAudioBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    if (pConfig->pData != NULL) {
        ma_copy_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    } else {
        ma_silence_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    }

    innerConfig.pData = &pAudioBuffer->_pExtraData[0];

    result = ma_audio_buffer_init_ex(&innerConfig, MA_FALSE, pAudioBuffer);
    if (result != MA_SUCCESS) {
        ma_free(pAudioBuffer, &innerConfig.allocationCallbacks);
        return result;
    }

    *ppAudioBuffer = pAudioBuffer;

    return MA_SUCCESS;
}